

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCRef * NULLCTypeInfo::MemberByIndex(NULLCRef *__return_storage_ptr__,NULLCRef obj,int member)

{
  ExternTypeInfo *pEVar1;
  ExternMemberInfo *pEVar2;
  ExternMemberInfo *memberList;
  ExternTypeInfo *exType;
  int member_local;
  
  if (linker == 0) {
    __assert_fail("linker",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                  ,0x4a,"NULLCRef NULLCTypeInfo::MemberByIndex(NULLCRef, int)");
  }
  __return_storage_ptr__->ptr = (char *)0x0;
  __return_storage_ptr__->typeID = 0;
  pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                     ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),obj.typeID);
  if ((pEVar1->subCat == CAT_CLASS) && ((uint)member < (pEVar1->field_8).arrSize)) {
    pEVar2 = FastVector<ExternMemberInfo,_false,_false>::operator[]
                       ((FastVector<ExternMemberInfo,_false,_false> *)(linker + 0x210),
                        (pEVar1->field_11).subType);
    __return_storage_ptr__->typeID = pEVar2[member].type;
    __return_storage_ptr__->ptr = obj.ptr + pEVar2[member].offset;
  }
  return __return_storage_ptr__;
}

Assistant:

NULLCRef MemberByIndex(NULLCRef obj, int member)
	{
		assert(linker);
		NULLCRef ret;
		ret.ptr = NULL;
		ret.typeID = 0;

		ExternTypeInfo &exType = linker->exTypes[obj.typeID];
		if((exType.subCat != ExternTypeInfo::CAT_CLASS) || ((unsigned)member >= exType.memberCount))
			return ret;

		ExternMemberInfo *memberList = &linker->exTypeExtra[exType.memberOffset];
		ret.typeID = memberList[member].type;
		ret.ptr = obj.ptr + memberList[member].offset;
		return ret;
	}